

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall Lib::Stack<unsigned_int>::reserve(Stack<unsigned_int> *this,size_t capacity)

{
  uint *__ptr;
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  ulong uVar4;
  
  if (this->_capacity < capacity) {
    puVar2 = (uint *)Lib::alloc(capacity * 4);
    __ptr = this->_stack;
    if (__ptr == (uint *)0x0) {
      this->_stack = puVar2;
      this->_cursor = puVar2;
      this->_capacity = capacity;
    }
    else {
      puVar1 = this->_cursor;
      for (uVar3 = 0; uVar4 = (ulong)uVar3, uVar4 < (ulong)((long)puVar1 - (long)__ptr >> 2);
          uVar3 = uVar3 + 1) {
        puVar2[uVar4] = __ptr[uVar4];
      }
      Lib::free(__ptr);
      this->_cursor = (uint *)(((long)this->_cursor - (long)this->_stack) + (long)puVar2);
      this->_capacity = capacity;
      this->_stack = puVar2;
    }
    this->_end = puVar2 + capacity;
  }
  return;
}

Assistant:

inline
  void reserve(size_t capacity) 
  {
    if (_capacity >= capacity) {
      return;
    }
    C* mem = static_cast<C*>(ALLOC_KNOWN(capacity*sizeof(C),className()));
    if (_stack) {
      for (unsigned i = 0; i < size(); i++) {
        ::new(&mem[i]) C(std::move((*this)[i]));
      }
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());

      _cursor = mem + (_cursor - _stack);
      _capacity = capacity;
      _stack = mem;
      _end = _stack + _capacity;
    } else {
      _stack = mem;
      _cursor = mem;
      _capacity = capacity;
      _end = _stack + _capacity;
    }
  }